

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

bool __thiscall CKey::Derive(CKey *this,CKey *keyChild,ChainCode *ccChild,uint nChild,ChainCode *cc)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uchar *puVar8;
  uchar *puVar9;
  byte *pbegin;
  byte *tweak32;
  int in_ECX;
  secp256k1_context *in_RSI;
  long in_FS_OFFSET;
  bool ret;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> vout;
  CPubKey pubkey;
  CKey *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffebc;
  uchar *in_stack_fffffffffffffec0;
  undefined1 fCompressedIn;
  allocator_type *in_stack_fffffffffffffec8;
  CKey *in_stack_fffffffffffffed0;
  uchar header;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> *in_stack_fffffffffffffed8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = IsValid(in_stack_fffffffffffffea8);
  if (!bVar5) {
    __assert_fail("IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x125,
                  "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const");
  }
  bVar5 = IsCompressed(in_stack_fffffffffffffea8);
  if (!bVar5) {
    __assert_fail("IsCompressed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x126,
                  "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const");
  }
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffed8,(size_type)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  header = (uchar)((ulong)in_stack_fffffffffffffed8 >> 0x18);
  if (in_ECX < 0) {
    uVar6 = size((CKey *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (uVar6 != 0x20) {
      __assert_fail("size() == 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x12d,
                    "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const")
      ;
    }
    begin(in_stack_fffffffffffffea8);
    UCharCast(&in_stack_fffffffffffffea8->fCompressed);
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffea8)
    ;
    BIP32Hash((ChainCode *)in_stack_fffffffffffffed0,
              (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),header,in_stack_fffffffffffffec0,
              (uchar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    fCompressedIn = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
  }
  else {
    GetPubKey(in_stack_fffffffffffffed0);
    uVar6 = CPubKey::size((CPubKey *)in_stack_fffffffffffffea8);
    if (uVar6 != 0x21) {
      __assert_fail("pubkey.size() == CPubKey::COMPRESSED_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x12a,
                    "bool CKey::Derive(CKey &, ChainCode &, unsigned int, const ChainCode &) const")
      ;
    }
    CPubKey::begin((CPubKey *)in_stack_fffffffffffffea8);
    CPubKey::begin((CPubKey *)in_stack_fffffffffffffea8);
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffea8)
    ;
    BIP32Hash((ChainCode *)in_stack_fffffffffffffed0,
              (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),header,in_stack_fffffffffffffec0,
              (uchar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    fCompressedIn = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
  }
  puVar8 = base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffea8);
  puVar9 = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                      in_stack_fffffffffffffea8);
  uVar2 = *(undefined8 *)(puVar9 + 0x20);
  uVar3 = *(undefined8 *)(puVar9 + 0x28);
  uVar4 = *(undefined8 *)(puVar9 + 0x38);
  *(undefined8 *)(puVar8 + 0x10) = *(undefined8 *)(puVar9 + 0x30);
  *(undefined8 *)(puVar8 + 0x18) = uVar4;
  *(undefined8 *)puVar8 = uVar2;
  *(undefined8 *)(puVar8 + 8) = uVar3;
  begin(in_stack_fffffffffffffea8);
  pbegin = begin(in_stack_fffffffffffffea8);
  Set<std::byte_const*>((CKey *)in_RSI,pbegin,(byte *)in_stack_fffffffffffffec8,(bool)fCompressedIn)
  ;
  tweak32 = begin(in_stack_fffffffffffffea8);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffea8);
  iVar7 = secp256k1_ec_seckey_tweak_add(in_RSI,pbegin,tweak32);
  bVar5 = iVar7 != 0;
  if (!bVar5) {
    ClearKeyData(in_stack_fffffffffffffea8);
  }
  uVar10 = CONCAT13(bVar5,(int3)in_stack_fffffffffffffeb8);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)CONCAT44(iVar7,uVar10));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)((byte)((uint)uVar10 >> 0x18) & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::Derive(CKey& keyChild, ChainCode &ccChild, unsigned int nChild, const ChainCode& cc) const {
    assert(IsValid());
    assert(IsCompressed());
    std::vector<unsigned char, secure_allocator<unsigned char>> vout(64);
    if ((nChild >> 31) == 0) {
        CPubKey pubkey = GetPubKey();
        assert(pubkey.size() == CPubKey::COMPRESSED_SIZE);
        BIP32Hash(cc, nChild, *pubkey.begin(), pubkey.begin()+1, vout.data());
    } else {
        assert(size() == 32);
        BIP32Hash(cc, nChild, 0, UCharCast(begin()), vout.data());
    }
    memcpy(ccChild.begin(), vout.data()+32, 32);
    keyChild.Set(begin(), begin() + 32, true);
    bool ret = secp256k1_ec_seckey_tweak_add(secp256k1_context_sign, (unsigned char*)keyChild.begin(), vout.data());
    if (!ret) keyChild.ClearKeyData();
    return ret;
}